

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkStatement
          (cmNinjaNormalTargetGenerator *this,string *config,string *fileConfig,string *outputDir,
          string *output)

{
  pointer *ppbVar1;
  undefined8 this_00;
  bool bVar2;
  __type _Var3;
  byte bVar4;
  uint uVar5;
  TargetType TVar6;
  cmGeneratorTarget *pcVar7;
  string *psVar8;
  cmLocalNinjaGenerator *pcVar9;
  mapped_type *pmVar10;
  cmLocalNinjaGenerator *this_01;
  mapped_type *linkFlags;
  cmMakefile *this_02;
  char *pcVar11;
  ulong uVar12;
  cmGeneratorTarget *pcVar13;
  size_t sVar14;
  cmGeneratedFileStream *os;
  __type local_a51;
  bool local_a2c;
  byte local_a2b;
  allocator<char> local_a2a;
  char local_a29;
  undefined1 local_a28 [4];
  bool usedResponseFile;
  string local_a08;
  int local_9e8;
  char local_9e2 [2];
  int commandLineLengthLimit;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9d8;
  char local_9ca [2];
  char *local_9c8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_9c0;
  allocator<char> local_9b1;
  key_type local_9b0;
  mapped_type *local_990;
  string *link_path;
  key_type local_980;
  mapped_type *local_960;
  string *linkLibraries;
  key_type local_950;
  string_view local_930;
  string local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  string local_8e0;
  undefined1 local_8c0 [8];
  string objPath;
  key_type local_898;
  string_view local_878;
  undefined1 local_868 [8];
  string impLibPath;
  key_type local_840;
  string_view local_820;
  string local_810;
  undefined1 local_7f0 [8];
  string install_dir;
  key_type local_7c8;
  string_view local_7a8;
  string local_798;
  allocator<char> local_771;
  key_type local_770;
  string local_750;
  undefined1 local_730 [8];
  Names tgtNames;
  key_type local_628;
  allocator<char> local_601;
  string local_600;
  undefined1 local_5e0 [8];
  string langFlags;
  key_type local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  allocator<char> local_571;
  key_type local_570;
  string local_550;
  allocator<char> local_529;
  string local_528;
  allocator<char> local_501;
  key_type local_500;
  allocator<char> local_4d9;
  key_type local_4d8;
  cmStateSnapshot local_4b8;
  cmStateDirectory local_4a0;
  undefined1 local_478 [8];
  cmNinjaLinkLineDeviceComputer linkLineComputer;
  key_type local_428;
  string_view local_408;
  string local_3f8;
  cmLocalNinjaGenerator *local_3d8;
  cmLocalNinjaGenerator *localGen;
  undefined1 local_3b0 [8];
  string createRule;
  string linkPath;
  string frameworkPath;
  cmNinjaDeps local_330;
  cmNinjaDeps local_318;
  pointer *local_300;
  cmNinjaVars *vars;
  char *local_2f0;
  string local_2e8;
  string local_2c8;
  undefined1 local_2a8 [8];
  cmNinjaBuild build;
  string local_180;
  byte local_159;
  string local_158;
  string local_138;
  int local_114;
  string local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  string targetOutputFileConfigDir;
  string local_80;
  undefined1 local_60 [8];
  string targetOutputImplib;
  cmGlobalNinjaGenerator *globalGen;
  cmGeneratorTarget *genTarget;
  string *output_local;
  string *outputDir_local;
  string *fileConfig_local;
  string *config_local;
  cmNinjaNormalTargetGenerator *this_local;
  
  pcVar7 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  targetOutputImplib.field_2._8_8_ =
       cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGeneratorTarget::GetFullPath(&local_80,pcVar7,config,ImportLibraryArtifact,false);
  psVar8 = cmNinjaTargetGenerator::ConvertToNinjaPath(&this->super_cmNinjaTargetGenerator,&local_80)
  ;
  std::__cxx11::string::string((string *)local_60,(string *)psVar8);
  std::__cxx11::string::~string((string *)&local_80);
  bVar2 = std::operator!=(config,fileConfig);
  if (bVar2) {
    pcVar9 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
    (*(pcVar9->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
      _vptr_cmOutputConverter[0x10])(&local_d0,pcVar9,pcVar7);
    (**(code **)(*(long *)targetOutputImplib.field_2._8_8_ + 0x268))
              (&local_f0,targetOutputImplib.field_2._8_8_,fileConfig);
    cmStrCat<std::__cxx11::string,std::__cxx11::string,char_const(&)[2]>
              ((string *)local_b0,&local_d0,&local_f0,(char (*) [2])0x11dc041);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    (**(code **)(*(long *)targetOutputImplib.field_2._8_8_ + 0xc0))
              (local_110,targetOutputImplib.field_2._8_8_,outputDir,fileConfig);
    std::__cxx11::string::operator=((string *)local_b0,local_110);
    std::__cxx11::string::~string(local_110);
    _Var3 = std::operator==(outputDir,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b0);
    if (_Var3) {
      local_114 = 1;
    }
    else {
      local_159 = 0;
      build.RspFile.field_2._M_local_buf[0xf] = '\0';
      cmGeneratorTarget::GetFullName(&local_138,pcVar7,config,ImportLibraryArtifact);
      uVar5 = std::__cxx11::string::empty();
      local_a51 = false;
      if ((uVar5 & 1) == 0) {
        cmGeneratorTarget::GetFullName(&local_158,pcVar7,fileConfig,ImportLibraryArtifact);
        local_159 = 1;
        uVar5 = std::__cxx11::string::empty();
        local_a51 = false;
        if ((uVar5 & 1) == 0) {
          cmGeneratorTarget::GetFullPath(&local_180,pcVar7,fileConfig,ImportLibraryArtifact,false);
          build.RspFile.field_2._M_local_buf[0xf] = '\x01';
          psVar8 = cmNinjaTargetGenerator::ConvertToNinjaPath
                             (&this->super_cmNinjaTargetGenerator,&local_180);
          local_a51 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_60,psVar8);
        }
      }
      if ((build.RspFile.field_2._M_local_buf[0xf] & 1U) != 0) {
        std::__cxx11::string::~string((string *)&local_180);
      }
      if ((local_159 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_158);
      }
      std::__cxx11::string::~string((string *)&local_138);
      if (local_a51 == false) {
        local_114 = 0;
      }
      else {
        local_114 = 1;
      }
    }
    std::__cxx11::string::~string((string *)local_b0);
    if (local_114 != 0) goto LAB_007e2038;
  }
  LanguageLinkerDeviceRule(&local_2c8,this,config);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_2a8,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  local_2f0 = GetVisibleTypeName(this);
  vars._7_1_ = 0x20;
  cmStrCat<char_const(&)[10],char_const*,char,std::__cxx11::string_const&>
            (&local_2e8,(char (*) [10])"Link the ",&local_2f0,(char *)((long)&vars + 7),output);
  std::__cxx11::string::operator=((string *)local_2a8,(string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  local_300 = &build.OrderOnlyDeps.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&build.Rule.field_2 + 8),output);
  cmNinjaTargetGenerator::GetObjects(&local_318,&this->super_cmNinjaTargetGenerator,config);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&build.WorkDirOuts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_318);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  TargetLinkLanguage((string *)((long)&frameworkPath.field_2 + 8),this,config);
  cmNinjaTargetGenerator::ComputeLinkDeps
            (&local_330,&this->super_cmNinjaTargetGenerator,
             (string *)((long)&frameworkPath.field_2 + 8),config,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&build.ExplicitDeps.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_330);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_330);
  std::__cxx11::string::~string((string *)(frameworkPath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(linkPath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(createRule.field_2._M_local_buf + 8));
  TargetLinkLanguage((string *)&localGen,this,config);
  cmGeneratorTarget::GetCreateRuleVariable((string *)local_3b0,pcVar7,(string *)&localGen,config);
  std::__cxx11::string::~string((string *)&localGen);
  pcVar9 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  local_3d8 = pcVar9;
  local_408 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)output);
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_3f8,(cmOutputConverter *)pcVar9,local_408,SHELL,false);
  ppbVar1 = local_300;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_428,"TARGET_FILE",(allocator<char> *)((long)&linkLineComputer.GG + 7))
  ;
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)ppbVar1,&local_428);
  std::__cxx11::string::operator=((string *)pmVar10,(string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator((allocator<char> *)((long)&linkLineComputer.GG + 7));
  std::__cxx11::string::~string((string *)&local_3f8);
  pcVar9 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  this_01 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  cmLocalGenerator::GetStateSnapshot(&local_4b8,(cmLocalGenerator *)this_01);
  cmStateSnapshot::GetDirectory(&local_4a0,&local_4b8);
  cmNinjaLinkLineDeviceComputer::cmNinjaLinkLineDeviceComputer
            ((cmNinjaLinkLineDeviceComputer *)local_478,(cmOutputConverter *)pcVar9,&local_4a0,
             (cmGlobalNinjaGenerator *)targetOutputImplib.field_2._8_8_);
  bVar4 = (**(code **)(*(long *)targetOutputImplib.field_2._8_8_ + 0x140))();
  cmLinkLineComputer::SetUseNinjaMulti((cmLinkLineComputer *)local_478,(bool)(bVar4 & 1));
  ppbVar1 = local_300;
  pcVar9 = local_3d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d8,"LINK_LIBRARIES",&local_4d9);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)ppbVar1,&local_4d8);
  ppbVar1 = local_300;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"LINK_FLAGS",&local_501);
  linkFlags = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)ppbVar1,&local_500);
  cmLocalGenerator::GetDeviceLinkFlags
            ((cmLocalGenerator *)pcVar9,(cmLinkLineDeviceComputer *)local_478,config,pmVar10,
             linkFlags,(string *)((long)&linkPath.field_2 + 8),
             (string *)((long)&createRule.field_2 + 8),pcVar7);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator(&local_501);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_528,"JOB_POOL_LINK",&local_529);
  cmNinjaTargetGenerator::addPoolNinjaVariable
            (&this->super_cmNinjaTargetGenerator,&local_528,pcVar7,(cmNinjaVars *)local_300);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator(&local_529);
  cmCommonTargetGenerator::GetManifests(&local_550,(cmCommonTargetGenerator *)this,config);
  ppbVar1 = local_300;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_570,"MANIFESTS",&local_571);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)ppbVar1,&local_570);
  std::__cxx11::string::operator=((string *)pmVar10,(string *)&local_550);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator(&local_571);
  std::__cxx11::string::~string((string *)&local_550);
  std::operator+(&local_598,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&linkPath.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&createRule.field_2 + 8));
  ppbVar1 = local_300;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,"LINK_PATH",
             (allocator<char> *)(langFlags.field_2._M_local_buf + 0xf));
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)ppbVar1,&local_5b8);
  std::__cxx11::string::operator=((string *)pmVar10,(string *)&local_598);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator((allocator<char> *)(langFlags.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::string((string *)local_5e0);
  pcVar9 = local_3d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,"CUDA",&local_601);
  cmLocalGenerator::AddLanguageFlagsForLinking
            ((cmLocalGenerator *)pcVar9,(string *)local_5e0,pcVar7,&local_600,config);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator(&local_601);
  ppbVar1 = local_300;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_628,"LANGUAGE_COMPILE_FLAGS",
             (allocator<char> *)(tgtNames.SharedObject.field_2._M_local_buf + 0xf));
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)ppbVar1,&local_628);
  std::__cxx11::string::operator=((string *)pmVar10,(string *)local_5e0);
  std::__cxx11::string::~string((string *)&local_628);
  std::allocator<char>::~allocator
            ((allocator<char> *)(tgtNames.SharedObject.field_2._M_local_buf + 0xf));
  TargetNames((Names *)local_730,this,config);
  bVar2 = cmGeneratorTarget::HasSOName(pcVar7,config);
  if (bVar2) {
    this_02 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
    TargetLinkLanguage(&local_750,this,config);
    pcVar11 = cmMakefile::GetSONameFlag(this_02,&local_750);
    ppbVar1 = local_300;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_770,"SONAME_FLAG",&local_771);
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)ppbVar1,&local_770);
    std::__cxx11::string::operator=((string *)pmVar10,pcVar11);
    std::__cxx11::string::~string((string *)&local_770);
    std::allocator<char>::~allocator(&local_771);
    std::__cxx11::string::~string((string *)&local_750);
    pcVar9 = local_3d8;
    local_7a8 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view
                          ((string *)(tgtNames.PDB.field_2._M_local_buf + 8));
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_798,(cmOutputConverter *)pcVar9,local_7a8,SHELL,false);
    ppbVar1 = local_300;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7c8,"SONAME",
               (allocator<char> *)(install_dir.field_2._M_local_buf + 0xf));
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)ppbVar1,&local_7c8);
    std::__cxx11::string::operator=((string *)pmVar10,(string *)&local_798);
    std::__cxx11::string::~string((string *)&local_7c8);
    std::allocator<char>::~allocator((allocator<char> *)(install_dir.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_798);
    TVar6 = cmGeneratorTarget::GetType(pcVar7);
    if (TVar6 == SHARED_LIBRARY) {
      pcVar13 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
      cmGeneratorTarget::GetInstallNameDirForBuildTree((string *)local_7f0,pcVar13,config);
      uVar12 = std::__cxx11::string::empty();
      pcVar9 = local_3d8;
      if ((uVar12 & 1) == 0) {
        local_820 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_7f0);
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  (&local_810,(cmOutputConverter *)pcVar9,local_820,SHELL,false);
        ppbVar1 = local_300;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_840,"INSTALLNAME_DIR",
                   (allocator<char> *)(impLibPath.field_2._M_local_buf + 0xf));
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)ppbVar1,&local_840);
        std::__cxx11::string::operator=((string *)pmVar10,(string *)&local_810);
        std::__cxx11::string::~string((string *)&local_840);
        std::allocator<char>::~allocator((allocator<char> *)(impLibPath.field_2._M_local_buf + 0xf))
        ;
        std::__cxx11::string::~string((string *)&local_810);
      }
      std::__cxx11::string::~string((string *)local_7f0);
    }
  }
  uVar12 = std::__cxx11::string::empty();
  pcVar9 = local_3d8;
  if ((uVar12 & 1) == 0) {
    local_878 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              ((string *)local_868,(cmOutputConverter *)pcVar9,local_878,SHELL,false);
    ppbVar1 = local_300;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_898,"TARGET_IMPLIB",
               (allocator<char> *)(objPath.field_2._M_local_buf + 0xf));
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)ppbVar1,&local_898);
    std::__cxx11::string::operator=((string *)pmVar10,(string *)local_868);
    std::__cxx11::string::~string((string *)&local_898);
    std::allocator<char>::~allocator((allocator<char> *)(objPath.field_2._M_local_buf + 0xf));
    cmNinjaTargetGenerator::EnsureParentDirectoryExists
              (&this->super_cmNinjaTargetGenerator,(string *)local_60);
    std::__cxx11::string::~string((string *)local_868);
  }
  pcVar13 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_8e0,pcVar13);
  (**(code **)(*(long *)targetOutputImplib.field_2._8_8_ + 0x268))
            (&local_900,targetOutputImplib.field_2._8_8_,config);
  cmStrCat<std::__cxx11::string,std::__cxx11::string>((string *)local_8c0,&local_8e0,&local_900);
  std::__cxx11::string::~string((string *)&local_900);
  std::__cxx11::string::~string((string *)&local_8e0);
  pcVar9 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  psVar8 = cmNinjaTargetGenerator::ConvertToNinjaPath
                     (&this->super_cmNinjaTargetGenerator,(string *)local_8c0);
  local_930 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar8);
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_920,(cmOutputConverter *)pcVar9,local_930,SHELL,false);
  ppbVar1 = local_300;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_950,"OBJECT_DIR",(allocator<char> *)((long)&linkLibraries + 7));
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)ppbVar1,&local_950);
  std::__cxx11::string::operator=((string *)pmVar10,(string *)&local_920);
  std::__cxx11::string::~string((string *)&local_950);
  std::allocator<char>::~allocator((allocator<char> *)((long)&linkLibraries + 7));
  std::__cxx11::string::~string((string *)&local_920);
  cmNinjaTargetGenerator::EnsureDirectoryExists
            (&this->super_cmNinjaTargetGenerator,(string *)local_8c0);
  cmNinjaTargetGenerator::SetMsvcTargetPdbVariable
            (&this->super_cmNinjaTargetGenerator,(cmNinjaVars *)local_300,config);
  ppbVar1 = local_300;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_980,"LINK_LIBRARIES",(allocator<char> *)((long)&link_path + 7));
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)ppbVar1,&local_980);
  std::__cxx11::string::~string((string *)&local_980);
  std::allocator<char>::~allocator((allocator<char> *)((long)&link_path + 7));
  ppbVar1 = local_300;
  local_960 = pmVar10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9b0,"LINK_PATH",&local_9b1);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)ppbVar1,&local_9b0);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::allocator<char>::~allocator(&local_9b1);
  local_990 = pmVar10;
  bVar2 = cmGlobalNinjaGenerator::IsGCCOnWindows
                    ((cmGlobalNinjaGenerator *)targetOutputImplib.field_2._8_8_);
  if (bVar2) {
    local_9c0._M_current = (char *)std::__cxx11::string::begin();
    local_9c8 = (char *)std::__cxx11::string::end();
    local_9ca[1] = 0x5c;
    local_9ca[0] = '/';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_9c0,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_9c8,local_9ca + 1,local_9ca);
    local_9d8._M_current = (char *)std::__cxx11::string::begin();
    _commandLineLengthLimit = (char *)std::__cxx11::string::end();
    local_9e2[1] = 0x5c;
    local_9e2[0] = '/';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_9d8,_commandLineLengthLimit,local_9e2 + 1,local_9e2);
  }
  sVar14 = cmSystemTools::CalculateCommandLineLengthLimit();
  local_9e8 = cmGlobalNinjaGenerator::GetRuleCmdLength
                        ((cmGlobalNinjaGenerator *)targetOutputImplib.field_2._8_8_,
                         (string *)((long)&build.Comment.field_2 + 8));
  local_9e8 = (int)sVar14 - local_9e8;
  psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar7);
  local_a2b = 0;
  bVar4 = (**(code **)(*(long *)targetOutputImplib.field_2._8_8_ + 0x140))();
  if ((bVar4 & 1) == 0) {
    std::allocator<char>::allocator();
    local_a2b = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_a28,"",&local_a2a);
  }
  else {
    local_a29 = '.';
    cmStrCat<char,std::__cxx11::string_const&>((string *)local_a28,&local_a29,config);
  }
  cmStrCat<char_const(&)[12],std::__cxx11::string_const&,std::__cxx11::string,char_const(&)[5]>
            (&local_a08,(char (*) [12])0x1158c88,psVar8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a28,
             (char (*) [5])0x1169ca2);
  psVar8 = cmNinjaTargetGenerator::ConvertToNinjaPath
                     (&this->super_cmNinjaTargetGenerator,&local_a08);
  std::__cxx11::string::operator=
            ((string *)&build.Variables._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (string *)psVar8);
  std::__cxx11::string::~string((string *)&local_a08);
  std::__cxx11::string::~string((string *)local_a28);
  if ((local_a2b & 1) != 0) {
    std::allocator<char>::~allocator(&local_a2a);
  }
  pcVar9 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  pcVar7 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  cmLocalNinjaGenerator::AppendTargetDepends
            (pcVar9,pcVar7,
             (cmNinjaDeps *)
             &build.ImplicitDeps.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,config,config,
             DependOnTargetArtifact);
  this_00 = targetOutputImplib.field_2._8_8_;
  local_a2c = false;
  os = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteBuild
            ((cmGlobalNinjaGenerator *)this_00,(ostream *)os,(cmNinjaBuild *)local_2a8,local_9e8,
             &local_a2c);
  WriteNvidiaDeviceLinkRule(this,(bool)(local_a2c & 1),config);
  std::__cxx11::string::~string((string *)local_8c0);
  cmGeneratorTarget::Names::~Names((Names *)local_730);
  std::__cxx11::string::~string((string *)local_5e0);
  cmNinjaLinkLineDeviceComputer::~cmNinjaLinkLineDeviceComputer
            ((cmNinjaLinkLineDeviceComputer *)local_478);
  std::__cxx11::string::~string((string *)local_3b0);
  std::__cxx11::string::~string((string *)(createRule.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(linkPath.field_2._M_local_buf + 8));
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_2a8);
  local_114 = 0;
LAB_007e2038:
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteNvidiaDeviceLinkStatement(
  const std::string& config, const std::string& fileConfig,
  const std::string& outputDir, const std::string& output)
{
  cmGeneratorTarget* genTarget = this->GetGeneratorTarget();
  cmGlobalNinjaGenerator* globalGen = this->GetGlobalGenerator();

  std::string targetOutputImplib = this->ConvertToNinjaPath(
    genTarget->GetFullPath(config, cmStateEnums::ImportLibraryArtifact));

  if (config != fileConfig) {
    std::string targetOutputFileConfigDir =
      cmStrCat(this->GetLocalGenerator()->GetTargetDirectory(genTarget),
               globalGen->ConfigDirectory(fileConfig), "/");
    targetOutputFileConfigDir =
      globalGen->ExpandCFGIntDir(outputDir, fileConfig);
    if (outputDir == targetOutputFileConfigDir) {
      return;
    }

    if (!genTarget->GetFullName(config, cmStateEnums::ImportLibraryArtifact)
           .empty() &&
        !genTarget
           ->GetFullName(fileConfig, cmStateEnums::ImportLibraryArtifact)
           .empty() &&
        targetOutputImplib ==
          this->ConvertToNinjaPath(genTarget->GetFullPath(
            fileConfig, cmStateEnums::ImportLibraryArtifact))) {
      return;
    }
  }

  // Compute the comment.
  cmNinjaBuild build(this->LanguageLinkerDeviceRule(config));
  build.Comment =
    cmStrCat("Link the ", this->GetVisibleTypeName(), ' ', output);

  cmNinjaVars& vars = build.Variables;

  // Compute outputs.
  build.Outputs.push_back(output);
  // Compute specific libraries to link with.
  build.ExplicitDeps = this->GetObjects(config);
  build.ImplicitDeps =
    this->ComputeLinkDeps(this->TargetLinkLanguage(config), config);

  std::string frameworkPath;
  std::string linkPath;

  std::string createRule =
    genTarget->GetCreateRuleVariable(this->TargetLinkLanguage(config), config);
  cmLocalNinjaGenerator& localGen = *this->GetLocalGenerator();

  vars["TARGET_FILE"] =
    localGen.ConvertToOutputFormat(output, cmOutputConverter::SHELL);

  cmNinjaLinkLineDeviceComputer linkLineComputer(
    this->GetLocalGenerator(),
    this->GetLocalGenerator()->GetStateSnapshot().GetDirectory(), globalGen);
  linkLineComputer.SetUseNinjaMulti(globalGen->IsMultiConfig());

  localGen.GetDeviceLinkFlags(linkLineComputer, config, vars["LINK_LIBRARIES"],
                              vars["LINK_FLAGS"], frameworkPath, linkPath,
                              genTarget);

  this->addPoolNinjaVariable("JOB_POOL_LINK", genTarget, vars);

  vars["MANIFESTS"] = this->GetManifests(config);

  vars["LINK_PATH"] = frameworkPath + linkPath;

  // Compute language specific link flags.
  std::string langFlags;
  localGen.AddLanguageFlagsForLinking(langFlags, genTarget, "CUDA", config);
  vars["LANGUAGE_COMPILE_FLAGS"] = langFlags;

  auto const tgtNames = this->TargetNames(config);
  if (genTarget->HasSOName(config)) {
    vars["SONAME_FLAG"] =
      this->GetMakefile()->GetSONameFlag(this->TargetLinkLanguage(config));
    vars["SONAME"] = localGen.ConvertToOutputFormat(tgtNames.SharedObject,
                                                    cmOutputConverter::SHELL);
    if (genTarget->GetType() == cmStateEnums::SHARED_LIBRARY) {
      std::string install_dir =
        this->GetGeneratorTarget()->GetInstallNameDirForBuildTree(config);
      if (!install_dir.empty()) {
        vars["INSTALLNAME_DIR"] = localGen.ConvertToOutputFormat(
          install_dir, cmOutputConverter::SHELL);
      }
    }
  }

  if (!tgtNames.ImportLibrary.empty()) {
    const std::string impLibPath = localGen.ConvertToOutputFormat(
      targetOutputImplib, cmOutputConverter::SHELL);
    vars["TARGET_IMPLIB"] = impLibPath;
    this->EnsureParentDirectoryExists(targetOutputImplib);
  }

  const std::string objPath =
    cmStrCat(this->GetGeneratorTarget()->GetSupportDirectory(),
             globalGen->ConfigDirectory(config));

  vars["OBJECT_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    this->ConvertToNinjaPath(objPath), cmOutputConverter::SHELL);
  this->EnsureDirectoryExists(objPath);

  this->SetMsvcTargetPdbVariable(vars, config);

  std::string& linkLibraries = vars["LINK_LIBRARIES"];
  std::string& link_path = vars["LINK_PATH"];
  if (globalGen->IsGCCOnWindows()) {
    // ar.exe can't handle backslashes in rsp files (implicitly used by gcc)
    std::replace(linkLibraries.begin(), linkLibraries.end(), '\\', '/');
    std::replace(link_path.begin(), link_path.end(), '\\', '/');
  }

  // Device linking currently doesn't support response files so
  // do not check if the user has explicitly forced a response file.
  int const commandLineLengthLimit =
    static_cast<int>(cmSystemTools::CalculateCommandLineLengthLimit()) -
    globalGen->GetRuleCmdLength(build.Rule);

  build.RspFile = this->ConvertToNinjaPath(
    cmStrCat("CMakeFiles/", genTarget->GetName(),
             globalGen->IsMultiConfig() ? cmStrCat('.', config) : "", ".rsp"));

  // Gather order-only dependencies.
  this->GetLocalGenerator()->AppendTargetDepends(
    this->GetGeneratorTarget(), build.OrderOnlyDeps, config, config,
    DependOnTargetArtifact);

  // Write the build statement for this target.
  bool usedResponseFile = false;
  globalGen->WriteBuild(this->GetCommonFileStream(), build,
                        commandLineLengthLimit, &usedResponseFile);
  this->WriteNvidiaDeviceLinkRule(usedResponseFile, config);
}